

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_merge_util.cpp
# Opt level: O0

bool spvtools::opt::blockmergeutil::CanMergeWithSuccessor(IRContext *context,BasicBlock *block)

{
  bool bVar1;
  Op OVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  CFG *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar5;
  FeatureManager *this_01;
  Instruction *this_02;
  StructuredCFGAnalysis *this_03;
  Function *this_04;
  uint local_8c;
  uint32_t target_id;
  uint32_t i;
  undefined1 local_78 [16];
  Instruction *switch_inst;
  uint32_t switch_merge_id;
  uint32_t switch_block_id;
  StructuredCFGAnalysis *struct_cfg;
  BasicBlock *pBStack_50;
  Op succ_term_op;
  BasicBlock *succ_block;
  bool succ_is_header;
  IRContext *pIStack_40;
  bool pred_is_header;
  Instruction *merge_inst;
  bool succ_is_merge;
  bool pred_is_merge;
  Instruction *pIStack_30;
  uint32_t lab_id;
  Instruction *br;
  iterator ii;
  BasicBlock *block_local;
  IRContext *context_local;
  
  ii.super_iterator.node_ = (iterator)(iterator)block;
  BasicBlock::end((BasicBlock *)&br);
  InstructionList::iterator::operator--((iterator *)&br);
  pIStack_30 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&br);
  OVar2 = opt::Instruction::opcode(pIStack_30);
  if (OVar2 == OpBranch) {
    merge_inst._4_4_ = opt::Instruction::GetSingleWordInOperand(pIStack_30,0);
    this = IRContext::cfg(context);
    this_00 = CFG::preds(this,merge_inst._4_4_);
    sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    if (sVar5 == 1) {
      merge_inst._3_1_ = anon_unknown_0::IsMerge(context,(BasicBlock *)ii.super_iterator.node_);
      merge_inst._2_1_ = anon_unknown_0::IsMerge(context,merge_inst._4_4_);
      if (((merge_inst._3_1_ & 1) == 0) || (!(bool)merge_inst._2_1_)) {
        if ((bool)merge_inst._2_1_) {
          this_01 = IRContext::get_feature_mgr(context);
          bVar1 = FeatureManager::HasExtension(this_01,kSPV_KHR_maximal_reconvergence);
          if (bVar1) {
            return false;
          }
        }
        if (((merge_inst._3_1_ & 1) == 0) ||
           (bVar1 = anon_unknown_0::IsContinue(context,merge_inst._4_4_), !bVar1)) {
          pIStack_40 = (IRContext *)BasicBlock::GetMergeInst((BasicBlock *)ii.super_iterator.node_);
          succ_block._7_1_ = anon_unknown_0::IsHeader((BasicBlock *)ii.super_iterator.node_);
          uVar4 = merge_inst._4_4_;
          if (((bool)succ_block._7_1_) &&
             (uVar3 = opt::Instruction::GetSingleWordInOperand((Instruction *)pIStack_40,0),
             uVar4 != uVar3)) {
            succ_block._6_1_ = anon_unknown_0::IsHeader(context,merge_inst._4_4_);
            if (((succ_block._7_1_ & 1) != 0) && ((bool)succ_block._6_1_)) {
              return false;
            }
            pBStack_50 = IRContext::get_instr_block(context,merge_inst._4_4_);
            this_02 = BasicBlock::terminator(pBStack_50);
            struct_cfg._4_4_ = opt::Instruction::opcode(this_02);
            OVar2 = opt::Instruction::opcode((Instruction *)pIStack_40);
            if (OVar2 != OpLoopMerge) {
              __assert_fail("merge_inst->opcode() == spv::Op::OpLoopMerge",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/block_merge_util.cpp"
                            ,0x86,
                            "bool spvtools::opt::blockmergeutil::CanMergeWithSuccessor(IRContext *, BasicBlock *)"
                           );
            }
            if ((struct_cfg._4_4_ != OpBranch) && (struct_cfg._4_4_ != OpBranchConditional)) {
              return false;
            }
          }
          if (((merge_inst._2_1_ & 1) != 0) ||
             (bVar1 = anon_unknown_0::IsContinue(context,merge_inst._4_4_), bVar1)) {
            this_03 = IRContext::GetStructuredCFGAnalysis(context);
            _switch_merge_id = this_03;
            uVar4 = BasicBlock::id((BasicBlock *)ii.super_iterator.node_);
            switch_inst._4_4_ = StructuredCFGAnalysis::ContainingSwitch(this_03,uVar4);
            if (switch_inst._4_4_ != 0) {
              switch_inst._0_4_ =
                   StructuredCFGAnalysis::SwitchMergeBlock(_switch_merge_id,switch_inst._4_4_);
              this_04 = BasicBlock::GetParent((BasicBlock *)ii.super_iterator.node_);
              _target_id = opt::Function::FindBlock(this_04,switch_inst._4_4_);
              UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                        ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&target_id);
              BasicBlock::tail((BasicBlock *)local_78);
              local_78._8_8_ =
                   utils::IntrusiveList<spvtools::opt::Instruction>::
                   iterator_template<spvtools::opt::Instruction>::operator*
                             ((iterator_template<spvtools::opt::Instruction> *)local_78);
              for (local_8c = 1;
                  uVar4 = opt::Instruction::NumInOperands((Instruction *)local_78._8_8_),
                  local_8c < uVar4; local_8c = local_8c + 2) {
                uVar4 = opt::Instruction::GetSingleWordInOperand
                                  ((Instruction *)local_78._8_8_,local_8c);
                uVar3 = BasicBlock::id((BasicBlock *)ii.super_iterator.node_);
                if ((uVar4 == uVar3) && (uVar4 != (uint32_t)switch_inst)) {
                  return false;
                }
              }
            }
          }
          context_local._7_1_ = true;
        }
        else {
          context_local._7_1_ = false;
        }
      }
      else {
        context_local._7_1_ = false;
      }
    }
    else {
      context_local._7_1_ = false;
    }
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool CanMergeWithSuccessor(IRContext* context, BasicBlock* block) {
  // Find block with single successor which has no other predecessors.
  auto ii = block->end();
  --ii;
  Instruction* br = &*ii;
  if (br->opcode() != spv::Op::OpBranch) {
    return false;
  }

  const uint32_t lab_id = br->GetSingleWordInOperand(0);
  if (context->cfg()->preds(lab_id).size() != 1) {
    return false;
  }

  bool pred_is_merge = IsMerge(context, block);
  bool succ_is_merge = IsMerge(context, lab_id);
  if (pred_is_merge && succ_is_merge) {
    // Cannot merge two merges together.
    return false;
  }

  // Note: This means that the instructions in a break block will execute as if
  // they were still diverged according to the loop iteration. This restricts
  // potential transformations an implementation may perform on the IR to match
  // shader author expectations. Similarly, instructions in the loop construct
  // cannot be moved into the continue construct unless it can be proven that
  // invocations are always converged.
  if (succ_is_merge && context->get_feature_mgr()->HasExtension(
                           kSPV_KHR_maximal_reconvergence)) {
    return false;
  }

  if (pred_is_merge && IsContinue(context, lab_id)) {
    // Cannot merge a continue target with a merge block.
    return false;
  }

  Instruction* merge_inst = block->GetMergeInst();
  const bool pred_is_header = IsHeader(block);
  if (pred_is_header && lab_id != merge_inst->GetSingleWordInOperand(0u)) {
    bool succ_is_header = IsHeader(context, lab_id);
    if (pred_is_header && succ_is_header) {
      // Cannot merge two headers together when the successor is not the merge
      // block of the predecessor.
      return false;
    }

    // If this is a header block and the successor is not its merge, we must
    // be careful about which blocks we are willing to merge together.
    // OpLoopMerge must be followed by a conditional or unconditional branch.
    // The merge must be a loop merge because a selection merge cannot be
    // followed by an unconditional branch.
    BasicBlock* succ_block = context->get_instr_block(lab_id);
    spv::Op succ_term_op = succ_block->terminator()->opcode();
    assert(merge_inst->opcode() == spv::Op::OpLoopMerge);
    if (succ_term_op != spv::Op::OpBranch &&
        succ_term_op != spv::Op::OpBranchConditional) {
      return false;
    }
  }

  if (succ_is_merge || IsContinue(context, lab_id)) {
    auto* struct_cfg = context->GetStructuredCFGAnalysis();
    auto switch_block_id = struct_cfg->ContainingSwitch(block->id());
    if (switch_block_id) {
      auto switch_merge_id = struct_cfg->SwitchMergeBlock(switch_block_id);
      const auto* switch_inst =
          &*block->GetParent()->FindBlock(switch_block_id)->tail();
      for (uint32_t i = 1; i < switch_inst->NumInOperands(); i += 2) {
        auto target_id = switch_inst->GetSingleWordInOperand(i);
        if (target_id == block->id() && target_id != switch_merge_id) {
          // Case constructs must be structurally dominated by the OpSwitch.
          // Since the successor is the merge/continue for another construct,
          // merging the blocks would break that requirement.
          return false;
        }
      }
    }
  }

  return true;
}